

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::PipelineCreateInfo::ViewportState::ViewportState
          (ViewportState *this,ViewportState *other)

{
  uint uVar1;
  VkViewport *__first;
  VkRect2D *__first_00;
  pointer pVVar2;
  allocator_type local_41;
  void *local_40 [2];
  long local_30;
  
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_VkPipelineViewportStateCreateInfo).sType =
       (other->super_VkPipelineViewportStateCreateInfo).sType;
  (this->super_VkPipelineViewportStateCreateInfo).pNext =
       (other->super_VkPipelineViewportStateCreateInfo).pNext;
  (this->super_VkPipelineViewportStateCreateInfo).flags =
       (other->super_VkPipelineViewportStateCreateInfo).flags;
  uVar1 = (other->super_VkPipelineViewportStateCreateInfo).viewportCount;
  (this->super_VkPipelineViewportStateCreateInfo).viewportCount = uVar1;
  (this->super_VkPipelineViewportStateCreateInfo).scissorCount =
       (other->super_VkPipelineViewportStateCreateInfo).scissorCount;
  __first = (other->super_VkPipelineViewportStateCreateInfo).pViewports;
  std::vector<vk::VkViewport,std::allocator<vk::VkViewport>>::vector<vk::VkViewport_const*,void>
            ((vector<vk::VkViewport,std::allocator<vk::VkViewport>> *)local_40,__first,
             __first + uVar1,&local_41);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::_M_move_assign
            (&this->m_viewports,local_40);
  if (local_40[0] != (void *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  __first_00 = (other->super_VkPipelineViewportStateCreateInfo).pScissors;
  std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::vector<vk::VkRect2D_const*,void>
            ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)local_40,__first_00,
             __first_00 + (this->super_VkPipelineViewportStateCreateInfo).scissorCount,
             (allocator_type *)&local_41);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::_M_move_assign
            (&this->m_scissors,local_40);
  if (local_40[0] != (void *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  pVVar2 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineViewportStateCreateInfo).pViewports =
       (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineViewportStateCreateInfo).pScissors = pVVar2;
  return;
}

Assistant:

PipelineCreateInfo::ViewportState::ViewportState (const ViewportState& other)
{
	sType			= other.sType;
	pNext			= other.pNext;
	flags			= other.flags;
	viewportCount	= other.viewportCount;
	scissorCount	= other.scissorCount;

	m_viewports = std::vector<vk::VkViewport>(other.pViewports, other.pViewports + viewportCount);
	m_scissors	= std::vector<vk::VkRect2D>(other.pScissors, other.pScissors + scissorCount);

	pViewports	= &m_viewports[0];
	pScissors	= &m_scissors[0];
}